

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>
::multiply_source_and_add_to
          (RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>
           *this,Field_element *coefficient,Index sourceColumnIndex,Index targetColumnIndex)

{
  Index local_1c;
  Index targetColumnIndex_local;
  Index sourceColumnIndex_local;
  Field_element *coefficient_local;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>
  *this_local;
  
  local_1c = sourceColumnIndex;
  _targetColumnIndex_local = coefficient;
  coefficient_local = (Field_element *)this;
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>
  ::multiply_source_and_add_to
            (&this->reducedMatrixR_,coefficient,sourceColumnIndex,targetColumnIndex);
  Base_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>
  ::multiply_source_and_add_to<unsigned_int>
            (&this->mirrorMatrixU_,_targetColumnIndex_local,&local_1c,targetColumnIndex);
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::multiply_source_and_add_to(const Field_element& coefficient,
                                                                 Index sourceColumnIndex,
                                                                 Index targetColumnIndex)
{
  static_assert(!Master_matrix::Option_list::is_z2,
                "Multiplication with something else than the identity is not allowed with Z2 coefficients.");
  reducedMatrixR_.multiply_source_and_add_to(coefficient, sourceColumnIndex, targetColumnIndex);
  mirrorMatrixU_.multiply_source_and_add_to(coefficient, sourceColumnIndex, targetColumnIndex);
}